

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_dictionary.hpp
# Opt level: O3

bool pd::prepareData(string *dir_name,string *data_filename,string *dict_filename,
                    uint32_t num_dimensions)

{
  error_code *peVar1;
  size_t *__k;
  uint uVar2;
  pointer pcVar3;
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  *pmVar4;
  directory_iterator dVar5;
  char cVar6;
  bool bVar7;
  char cVar8;
  int iVar9;
  istream *piVar10;
  iterator iVar11;
  mapped_type *pmVar12;
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  *pmVar13;
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  *pmVar14;
  ostream *poVar15;
  basic_ostream<char,_std::char_traits<char>_> *pbVar16;
  uint uVar17;
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  *pmVar18;
  uint uVar19;
  long local_558;
  ofstream of;
  ios_base local_460 [264];
  intrusive_ptr<boost::filesystem::detail::dir_itr_imp> local_358;
  ifstream fi;
  dir_itr_imp local_348 [16];
  byte abStack_338 [488];
  undefined1 local_150 [8];
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  dict;
  long local_110;
  __node_base local_108 [2];
  undefined1 local_f8 [8];
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  result;
  string line;
  directory_iterator it;
  directory_iterator eod;
  undefined1 local_90 [8];
  path targetDir;
  uint32_t key;
  undefined4 uStack_64;
  undefined1 local_60 [16];
  intrusive_ptr<boost::filesystem::detail::dir_itr_imp> local_50;
  directory_iterator local_48;
  intrusive_ptr<boost::filesystem::detail::dir_itr_imp> local_40;
  intrusive_ptr<boost::filesystem::detail::dir_itr_imp> local_38;
  
  local_150 = (undefined1  [8])&dict._M_h._M_rehash_policy._M_next_resize;
  dict._M_h._M_buckets = (__buckets_ptr)0x1;
  dict._M_h._M_bucket_count = 0;
  dict._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  dict._M_h._M_element_count._0_4_ = 0x3f800000;
  dict._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  dict._M_h._M_rehash_policy._4_4_ = 0;
  dict._M_h._M_rehash_policy._M_next_resize = 0;
  bVar7 = readDictionary(dict_filename,
                         (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                          *)local_150);
  if (bVar7) {
    local_90 = (undefined1  [8])&targetDir.m_pathname._M_string_length;
    pcVar3 = (dir_name->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_90,pcVar3,pcVar3 + dir_name->_M_string_length);
    boost::filesystem::directory_iterator::directory_iterator
              ((directory_iterator *)((long)&line.field_2 + 8),(path *)local_90,none);
    it.m_imp.px = (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)(dir_itr_imp *)0x0;
    std::ofstream::ofstream(&local_558,(string *)data_filename,_S_out);
    local_358.px = (dir_itr_imp *)line.field_2._8_8_;
    if (line.field_2._8_8_ != 0) {
      LOCK();
      *(int *)line.field_2._8_8_ = *(int *)line.field_2._8_8_ + 1;
      UNLOCK();
    }
    _fi = it.m_imp.px;
    if (it.m_imp.px != (dir_itr_imp *)0x0) {
      LOCK();
      *(int *)it.m_imp.px = *(int *)it.m_imp.px + 1;
      UNLOCK();
    }
    local_40.px = (dir_itr_imp *)line.field_2._8_8_;
    if (line.field_2._8_8_ != 0) {
      LOCK();
      *(int *)line.field_2._8_8_ = *(int *)line.field_2._8_8_ + 1;
      UNLOCK();
    }
    local_38 = it.m_imp.px;
    if (it.m_imp.px != (dir_itr_imp *)0x0) {
      LOCK();
      *(int *)it.m_imp.px = *(int *)it.m_imp.px + 1;
      UNLOCK();
    }
    boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr
              ((intrusive_ptr<boost::filesystem::detail::dir_itr_imp> *)&fi);
    boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_358);
    local_358.px = local_40.px;
    if (local_40.px == (dir_itr_imp *)0x0) {
      local_48.m_imp.px = (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)(dir_itr_imp *)0x0;
    }
    else {
      LOCK();
      *(int *)local_40.px = *(int *)local_40.px + 1;
      UNLOCK();
      local_48.m_imp.px =
           (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)
           (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)local_40.px;
      if (local_40.px != (dir_itr_imp *)0x0) {
        LOCK();
        *(int *)local_40.px = *(int *)local_40.px + 1;
        UNLOCK();
      }
    }
    boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_358);
    local_358.px = local_38.px;
    if (local_38.px == (dir_itr_imp *)0x0) {
      local_50.px = (dir_itr_imp *)0x0;
    }
    else {
      LOCK();
      *(int *)local_38.px = *(int *)local_38.px + 1;
      UNLOCK();
      local_50.px = local_38.px;
      if (local_38.px != (dir_itr_imp *)0x0) {
        LOCK();
        *(int *)local_38.px = *(int *)local_38.px + 1;
        UNLOCK();
      }
    }
    boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_358);
    __k = &result._M_t._M_impl.super__Rb_tree_header._M_node_count;
    while (dVar5.m_imp.px = local_48.m_imp.px,
          local_48.m_imp.px != (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)local_50.px) {
      if ((local_48.m_imp.px == (dir_itr_imp *)0x0) ||
         (*(long *)((long)local_48.m_imp.px + 0x38) == 0)) {
        if ((local_50.px == (dir_itr_imp *)0x0) || (*(long *)(local_50.px + 0x38) == 0)) break;
        if ((local_48.m_imp.px == (dir_itr_imp *)0x0) ||
           (*(long *)((long)local_48.m_imp.px + 0x38) == 0)) {
          __assert_fail("(!is_end())&&(\"attempt to dereference end directory iterator\")",
                        "/usr/include/boost/filesystem/directory.hpp",0x140,
                        "boost::iterator_facade<directory_iterator, directory_entry, boost::single_pass_traversal_tag>::reference boost::filesystem::directory_iterator::dereference() const"
                       );
        }
      }
      peVar1 = (error_code *)((long)local_48.m_imp.px + 8);
      boost::filesystem::detail::status((path *)&local_358,peVar1);
      if ((int)local_358.px == 2) {
        boost::filesystem::path::extension();
        iVar9 = boost::filesystem::path::compare((path *)&local_358,"swp");
        if (local_358.px != local_348) {
          operator_delete(local_358.px);
        }
        if (iVar9 != 0) {
          std::ifstream::ifstream((istream *)&local_358,(string *)peVar1,_S_in);
          if ((abStack_338[*(long *)(local_358.px + -0x18)] & 5) != 0) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"File ",5);
            poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,*(char **)((long)dVar5.m_imp.px + 8),
                                 *(long *)((long)dVar5.m_imp.px + 0x10));
            std::__ostream_insert<char,std::char_traits<char>>(poVar15,"doesn\'t exist",0xd);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
            std::ostream::put((char)poVar15);
            std::ostream::flush();
            std::ifstream::~ifstream(&local_358);
            boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_50);
            boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr
                      (&local_48.m_imp);
            bVar7 = false;
            goto LAB_0010d4c6;
          }
          result._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)&line._M_string_length;
          line._M_dataplus._M_p = (pointer)0x0;
          line._M_string_length._0_1_ = 0;
          result._M_t._M_impl._0_4_ = 0;
          result._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          result._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
          result._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&result;
          result._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
          result._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               result._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          while( true ) {
            cVar8 = std::ios::widen((char)*(undefined8 *)(local_358.px + -0x18) +
                                    (char)(istream *)&local_358);
            piVar10 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                ((istream *)&local_358,(string *)__k,cVar8);
            if ((((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) != 0) ||
               (line._M_dataplus._M_p == (pointer)0x0)) break;
            iVar11 = std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                             *)local_150,(key_type *)__k);
            if (iVar11.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
                ._M_cur != (__node_type *)0x0) {
              targetDir.m_pathname.field_2._8_4_ =
                   *(uint *)((long)iVar11.
                                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
                                   ._M_cur + 0x28) % num_dimensions;
              pmVar12 = std::
                        map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                        ::operator[]((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                      *)local_f8,
                                     (key_type *)(targetDir.m_pathname.field_2._M_local_buf + 8));
              *pmVar12 = *pmVar12 + 1;
            }
          }
          if (num_dimensions != 0) {
            uVar19 = 0;
            do {
              if (result._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ == 0) {
LAB_0010d2f4:
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_558,"0,",2);
              }
              else {
                pmVar14 = &result;
                pmVar4 = (map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                          *)result._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
                do {
                  pmVar18 = pmVar4;
                  pmVar13 = pmVar14;
                  uVar2 = *(uint *)&(pmVar18->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right
                  ;
                  pmVar14 = pmVar18;
                  if (uVar2 < uVar19) {
                    pmVar14 = pmVar13;
                  }
                  pmVar4 = (map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                            *)(&(pmVar18->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent)
                              [uVar2 < uVar19];
                } while (pmVar4 != (map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                    *)0x0);
                if (pmVar14 == &result) goto LAB_0010d2f4;
                if (uVar2 < uVar19) {
                  pmVar18 = pmVar13;
                }
                if (uVar19 < *(uint *)&(pmVar18->_M_t)._M_impl.super__Rb_tree_header._M_header.
                                       _M_right) goto LAB_0010d2f4;
                uVar2 = *(uint *)((long)&(pmVar14->_M_t)._M_impl.super__Rb_tree_header._M_header.
                                         _M_right + 4);
                cVar8 = '\x01';
                if (9 < uVar2) {
                  uVar17 = uVar2;
                  cVar6 = '\x04';
                  do {
                    cVar8 = cVar6;
                    if (uVar17 < 100) {
                      cVar8 = cVar8 + -2;
                      goto LAB_0010d36c;
                    }
                    if (uVar17 < 1000) {
                      cVar8 = cVar8 + -1;
                      goto LAB_0010d36c;
                    }
                    if (uVar17 < 10000) goto LAB_0010d36c;
                    bVar7 = 99999 < uVar17;
                    uVar17 = uVar17 / 10000;
                    cVar6 = cVar8 + '\x04';
                  } while (bVar7);
                  cVar8 = cVar8 + '\x01';
                }
LAB_0010d36c:
                targetDir.m_pathname.field_2._8_8_ = local_60;
                std::__cxx11::string::_M_construct
                          ((ulong)((long)&targetDir.m_pathname.field_2 + 8),cVar8);
                std::__detail::__to_chars_10_impl<unsigned_int>
                          ((char *)targetDir.m_pathname.field_2._8_8_,key,uVar2);
                poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&local_558,
                                     (char *)targetDir.m_pathname.field_2._8_8_,
                                     CONCAT44(uStack_64,key));
                std::__ostream_insert<char,std::char_traits<char>>(poVar15,",",1);
                if ((undefined1 *)targetDir.m_pathname.field_2._8_8_ != local_60) {
                  operator_delete((void *)targetDir.m_pathname.field_2._8_8_);
                }
              }
              uVar19 = uVar19 + 1;
            } while (uVar19 != num_dimensions);
          }
          boost::filesystem::path::filename();
          targetDir.m_pathname.field_2._8_8_ = local_60;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)((long)&targetDir.m_pathname.field_2 + 8),dict._M_h._M_single_bucket,
                     (long)&(dict._M_h._M_single_bucket)->_M_nxt + local_110);
          pbVar16 = boost::io::detail::
                    quoted_out<char,std::char_traits<char>,std::__cxx11::string_const>
                              ((basic_ostream<char,_std::char_traits<char>_> *)&local_558,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&targetDir.m_pathname.field_2 + 8),'&','\"');
          if ((undefined1 *)targetDir.m_pathname.field_2._8_8_ != local_60) {
            operator_delete((void *)targetDir.m_pathname.field_2._8_8_);
          }
          std::ios::widen((char)*(undefined8 *)(*(long *)pbVar16 + -0x18) + (char)pbVar16);
          std::ostream::put((char)pbVar16);
          std::ostream::flush();
          if (dict._M_h._M_single_bucket != local_108) {
            operator_delete(dict._M_h._M_single_bucket);
          }
          std::
          _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
          ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                       *)local_f8);
          if ((size_type *)result._M_t._M_impl.super__Rb_tree_header._M_node_count !=
              &line._M_string_length) {
            operator_delete((void *)result._M_t._M_impl.super__Rb_tree_header._M_node_count);
          }
          std::ifstream::~ifstream((istream *)&local_358);
        }
      }
      boost::filesystem::detail::directory_iterator_increment(&local_48,(error_code *)0x0);
    }
    boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_50);
    boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_48.m_imp);
    bVar7 = true;
LAB_0010d4c6:
    boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_38);
    boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_40);
    local_558 = _VTT;
    *(undefined8 *)((long)&local_558 + *(long *)(_VTT + -0x18)) = _sentry;
    std::filebuf::~filebuf((filebuf *)&of);
    std::ios_base::~ios_base(local_460);
    boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&it.m_imp);
    boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr
              ((intrusive_ptr<boost::filesystem::detail::dir_itr_imp> *)((long)&line.field_2 + 8));
    if (local_90 != (undefined1  [8])&targetDir.m_pathname._M_string_length) {
      operator_delete((void *)local_90);
    }
  }
  else {
    bVar7 = false;
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_150);
  return bVar7;
}

Assistant:

bool prepareData(const std::string& dir_name, const std::string& data_filename, const std::string& dict_filename, const uint32_t num_dimensions)
    {
        std::unordered_map<std::string, uint32_t> dict;
        if (!readDictionary(dict_filename, dict))
            return false;
        
        fs::path targetDir(dir_name); 
        fs::directory_iterator it(targetDir), eod;

        std::ofstream of(data_filename);
        BOOST_FOREACH(const fs::path &p, std::make_pair(it, eod))   
        { 
            if(is_regular_file(p))
            {
                if (p.extension() == "swp")
                    continue;
                std::ifstream fi(p.string());
                if (not fi)
                {
                    std::cerr << "File " << p.string() << "doesn't exist" << std::endl;
                    return false;
                }

                std::string line;
                std::map<uint32_t, uint32_t> result;
                std::hash<uint32_t> uint32_hash;
                while (std::getline(fi, line) and !line.empty())
                {
                    const std::unordered_map<std::string, uint32_t>::const_iterator it = dict.find(line);
                    if (it == dict.end())
                        continue;
                    
                    uint32_t key = uint32_hash(it->second) % num_dimensions;
                    result[key]++;
                }
                
                for (uint32_t i = 0; i < num_dimensions; i++)
                {
                    const std::map<uint32_t, uint32_t>::const_iterator it = result.find(i);
                    if (it == result.end())
                        of << "0,";
                    else
                        of << std::to_string(it->second) << ",";    
                }
                of << p.filename() << std::endl;
            } 
        }
        return true;
    }